

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O1

void __thiscall insyde_fdm_t::~insyde_fdm_t(insyde_fdm_t *this)

{
  kstream *pkVar1;
  pointer pcVar2;
  fdm_entries_t *pfVar3;
  fdm_board_ids_t *pfVar4;
  fdm_extensions_t *pfVar5;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__insyde_fdm_t_00184ef0;
  pkVar1 = (this->m__io__raw_entries)._M_t.
           super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
           super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
  if (pkVar1 != (kstream *)0x0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&pkVar1->m_io_str);
    std::ios_base::~ios_base((ios_base *)&pkVar1->field_0x80);
    operator_delete(pkVar1);
  }
  (this->m__io__raw_entries)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = (kstream *)0x0;
  pcVar2 = (this->m__raw_entries)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m__raw_entries).field_2) {
    operator_delete(pcVar2);
  }
  pkVar1 = (this->m__io__raw_extensions)._M_t.
           super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
           super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
  if (pkVar1 != (kstream *)0x0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&pkVar1->m_io_str);
    std::ios_base::~ios_base((ios_base *)&pkVar1->field_0x80);
    operator_delete(pkVar1);
  }
  (this->m__io__raw_extensions)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = (kstream *)0x0;
  pcVar2 = (this->m__raw_extensions)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m__raw_extensions).field_2) {
    operator_delete(pcVar2);
  }
  pfVar3 = (this->m_entries)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl;
  if (pfVar3 != (fdm_entries_t *)0x0) {
    (**(code **)((long)(pfVar3->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl = (fdm_entries_t *)0x0;
  pfVar4 = (this->m_board_ids)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl;
  if (pfVar4 != (fdm_board_ids_t *)0x0) {
    (**(code **)((long)(pfVar4->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_board_ids)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl =
       (fdm_board_ids_t *)0x0;
  pfVar5 = (this->m_extensions)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl;
  if (pfVar5 != (fdm_extensions_t *)0x0) {
    (**(code **)((long)(pfVar5->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_extensions)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl =
       (fdm_extensions_t *)0x0;
  return;
}

Assistant:

insyde_fdm_t::~insyde_fdm_t() {
    _clean_up();
}